

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

void __thiscall ON_SubDQuadNeighborhood::SetPatchStatus(ON_SubDQuadNeighborhood *this,uint fvi0)

{
  ON_SubDEdge *pOVar1;
  ON_SubDEdge *this_00;
  ON_2dex max_face_grid_dex_00;
  ON_2dex min_face_grid_dex_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDFace *pOVar5;
  double dVar6;
  byte local_e3;
  bool local_e2;
  bool local_e1;
  bool local_e0;
  bool local_df;
  bool local_de;
  bool local_dd;
  int local_dc;
  uint local_c0;
  uint local_bc;
  uint corner_index_3;
  uint corner_index_2;
  ON_SubDEdge *e2;
  ON_SubDEdge *e1;
  ON_SubDFace *f_1;
  ON_SubDEdge *e_1;
  ON_SubDFace *f;
  ON_SubDEdge *e;
  byte local_80 [3];
  bool local_7d;
  uint corner_index_1;
  bool bQuadVertexIsSmoothOrCrease [4];
  uint corner_index;
  ON_SubDVertex *quad_vertex [4];
  bool bExtraordinaryCornerVertex [4];
  uint boundary_corner_corner_index;
  uint boundary_crease_corner_index;
  uint i_1;
  bool bSharpQuadrant [4];
  uint i;
  byte local_38 [3];
  bool bEdgeTagX;
  bool bCenterEdgeIsCrease [4];
  bool bCenterEdgeIsSmooth [4];
  uint fvi3;
  uint fvi2;
  uint fvi1;
  ON_2dex max_face_grid_dex;
  ON_2dex min_face_grid_dex;
  uint delta_subdivision_level;
  uint fvi0_local;
  ON_SubDQuadNeighborhood *this_local;
  
  this->m_bIsCubicPatch = false;
  if (this->m_initial_subdivision_level < this->m_current_subdivision_level) {
    local_dc = (uint)this->m_current_subdivision_level - (uint)this->m_initial_subdivision_level;
  }
  else {
    local_dc = 0;
  }
  ON_2dex::ON_2dex(&max_face_grid_dex,0,0);
  ON_2dex::ON_2dex((ON_2dex *)&fvi2,3,3);
  this->m_boundary_crease_count = '\0';
  if ((this->m_bBoundaryCrease[0] & 1U) != 0) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    max_face_grid_dex.j = max_face_grid_dex.j + 1;
  }
  if ((this->m_bBoundaryCrease[1] & 1U) != 0) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    fvi2 = fvi2 - 1;
  }
  if ((this->m_bBoundaryCrease[2] & 1U) != 0) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    fvi1 = fvi1 - 1;
  }
  if ((this->m_bBoundaryCrease[3] & 1U) != 0) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    max_face_grid_dex.i = max_face_grid_dex.i + 1;
  }
  uVar3 = fvi0 + 1 & 3;
  uVar4 = fvi0 + 2 & 3;
  bCenterEdgeIsCrease = (bool  [4])(fvi0 + 3 & 3);
  memset(local_38,0,4);
  bVar2 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[fvi0]);
  local_38[fvi0] = bVar2;
  if (local_dc == 0) {
    local_dd = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar3]);
  }
  else {
    local_dd = true;
  }
  local_38[uVar3] = local_dd;
  if (local_dc == 0) {
    local_de = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar4]);
  }
  else {
    local_de = true;
  }
  local_38[uVar4] = local_de;
  bVar2 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[(uint)bCenterEdgeIsCrease]);
  local_38[(uint)bCenterEdgeIsCrease] = bVar2;
  memset(&i,0,4);
  if ((local_38[fvi0] & 1) == 0) {
    local_df = ON_SubDEdge::IsCrease(this->m_center_edges[fvi0]);
  }
  else {
    local_df = false;
  }
  local_38[(ulong)fvi0 - 4] = local_df;
  if (local_dc == 0) {
    local_e0 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar3]);
  }
  else {
    local_e0 = false;
  }
  local_38[(ulong)uVar3 - 4] = local_e0;
  if (local_dc == 0) {
    local_e1 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar4]);
  }
  else {
    local_e1 = false;
  }
  local_38[(ulong)uVar4 - 4] = local_e1;
  if ((local_38[(uint)bCenterEdgeIsCrease] & 1) == 0) {
    local_e2 = ON_SubDEdge::IsCrease(this->m_center_edges[(uint)bCenterEdgeIsCrease]);
  }
  else {
    local_e2 = false;
  }
  local_38[(ulong)(uint)bCenterEdgeIsCrease - 4] = local_e2;
  bSharpQuadrant[3] = false;
  i_1 = 0;
  do {
    if (3 < i_1) {
LAB_008fc9df:
      this->m_sharp_edge_count = '\0';
      memset(&boundary_crease_corner_index,0,4);
      for (boundary_corner_corner_index = 0; boundary_corner_corner_index < 4;
          boundary_corner_corner_index = boundary_corner_corner_index + 1) {
        if ((this->m_center_edges[boundary_corner_corner_index] != (ON_SubDEdge *)0x0) &&
           (bVar2 = ON_SubDEdge::IsSharp(this->m_center_edges[boundary_corner_corner_index]), bVar2)
           ) {
          this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
          boundary_crease_corner_index._0_1_ = 1;
          boundary_crease_corner_index._1_1_ = 1;
          boundary_crease_corner_index._2_1_ = 1;
          boundary_crease_corner_index._3_1_ = 1;
        }
        if ((this->m_edge_grid[boundary_corner_corner_index][0] != (ON_SubDEdge *)0x0) &&
           (bVar2 = ON_SubDEdge::IsSharp(this->m_edge_grid[boundary_corner_corner_index][0]), bVar2)
           ) {
          this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
          *(undefined1 *)((long)&boundary_crease_corner_index + (ulong)boundary_corner_corner_index)
               = 1;
          *(undefined1 *)
           ((long)&boundary_crease_corner_index + (ulong)(boundary_corner_corner_index + 1 & 3)) = 1
          ;
          *(undefined1 *)
           ((long)&boundary_crease_corner_index + (ulong)(boundary_corner_corner_index + 3 & 3)) = 1
          ;
        }
        if ((this->m_edge_grid[boundary_corner_corner_index][1] != (ON_SubDEdge *)0x0) &&
           (bVar2 = ON_SubDEdge::IsSharp(this->m_edge_grid[boundary_corner_corner_index][1]), bVar2)
           ) {
          this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
          *(undefined1 *)
           ((long)&boundary_crease_corner_index + (ulong)(boundary_corner_corner_index & 3)) = 1;
          *(undefined1 *)
           ((long)&boundary_crease_corner_index + (ulong)(boundary_corner_corner_index + 1 & 3)) = 1
          ;
          *(undefined1 *)
           ((long)&boundary_crease_corner_index + (ulong)(boundary_corner_corner_index + 3 & 3)) = 1
          ;
        }
      }
      bExtraordinaryCornerVertex[0] = true;
      bExtraordinaryCornerVertex[1] = false;
      bExtraordinaryCornerVertex[2] = false;
      bExtraordinaryCornerVertex[3] = false;
      quad_vertex[3]._4_1_ = true;
      quad_vertex[3]._5_1_ = false;
      quad_vertex[3]._6_1_ = false;
      quad_vertex[3]._7_1_ = false;
      memset(quad_vertex + 3,0,4);
      *(undefined1 *)((long)quad_vertex + (ulong)fvi0 + 0x18) = 1;
      local_e3 = 1;
      if (local_dc != 0) {
        local_e3 = bSharpQuadrant[3];
      }
      *(byte *)((long)quad_vertex + (ulong)uVar3 + 0x18) = local_e3 & 1;
      *(byte *)((long)quad_vertex + (ulong)uVar4 + 0x18) =
           *(byte *)((long)quad_vertex + (ulong)uVar3 + 0x18) & 1;
      *(byte *)((long)quad_vertex + (ulong)(uint)bCenterEdgeIsCrease + 0x18) =
           *(byte *)((long)quad_vertex + (ulong)uVar3 + 0x18) & 1;
      _bQuadVertexIsSmoothOrCrease = this->m_vertex_grid[1][1];
      quad_vertex[0] = this->m_vertex_grid[2][1];
      quad_vertex[1] = this->m_vertex_grid[2][2];
      quad_vertex[2] = this->m_vertex_grid[1][2];
      for (corner_index_1 = 0; corner_index_1 < 4; corner_index_1 = corner_index_1 + 1) {
        dVar6 = ON_SubDVertex::VertexSharpness
                          (*(ON_SubDVertex **)
                            (bQuadVertexIsSmoothOrCrease + (ulong)corner_index_1 * 8));
        if (0.0 < dVar6) {
          *(undefined1 *)((long)&boundary_crease_corner_index + (ulong)corner_index_1) = 1;
          *(undefined1 *)((long)&boundary_crease_corner_index + (ulong)(corner_index_1 + 1 & 3)) = 1
          ;
          *(undefined1 *)((long)&boundary_crease_corner_index + (ulong)(corner_index_1 + 3 & 3)) = 1
          ;
        }
      }
      if ((bSharpQuadrant[3] & 1U) == 0) {
        local_80[0] = ON_SubDVertex::IsSmoothOrCrease(_bQuadVertexIsSmoothOrCrease);
        local_80[1] = ON_SubDVertex::IsSmoothOrCrease(quad_vertex[0]);
        local_80[2] = ON_SubDVertex::IsSmoothOrCrease(quad_vertex[1]);
        local_7d = ON_SubDVertex::IsSmoothOrCrease(quad_vertex[2]);
        e._4_1_ = false;
        e._5_1_ = false;
        e._6_1_ = false;
        e._7_1_ = false;
        for (; (uint)e._4_4_ < 4; e._4_4_ = (bool  [4])((int)e._4_4_ + 1)) {
          if (((((*(byte *)((long)quad_vertex + (ulong)(uint)e._4_4_ + 0x18) & 1) != 0) &&
               (bVar2 = ON_SubDVertex::IsDart
                                  (*(ON_SubDVertex **)
                                    (bQuadVertexIsSmoothOrCrease + (ulong)(uint)e._4_4_ * 8)),
               !bVar2)) && ((local_80[(int)e._4_4_ + 1U & 3] & 1) != 0)) &&
             ((local_80[(int)e._4_4_ + 3U & 3] & 1) != 0)) {
            if (((local_38[(uint)e._4_4_] & 1) == 0) || ((local_38[(int)e._4_4_ + 3U & 3] & 1) == 0)
               ) {
              if (((local_38[(ulong)(uint)e._4_4_ - 4] & 1) == 0) ||
                 ((local_38[(int)e._4_4_ + 3U & 3] & 1) == 0)) {
                if (((local_38[(uint)e._4_4_] & 1) == 0) ||
                   ((local_38[(ulong)((int)e._4_4_ + 3U & 3) - 4] & 1) == 0)) {
                  if (((local_38[(ulong)(uint)e._4_4_ - 4] & 1) != 0) &&
                     (((local_38[(ulong)((int)e._4_4_ + 3U & 3) - 4] & 1) != 0 &&
                      ((((bVar2 = ON_SubDVertex::IsCrease
                                            (*(ON_SubDVertex **)
                                              (bQuadVertexIsSmoothOrCrease +
                                              (ulong)(uint)e._4_4_ * 8)), bVar2 ||
                         (bVar2 = ON_SubDVertex::IsCorner
                                            (*(ON_SubDVertex **)
                                              (bQuadVertexIsSmoothOrCrease +
                                              (ulong)(uint)e._4_4_ * 8)), bVar2)) &&
                        (bVar2 = ON_SubDVertex::IsCrease
                                           (*(ON_SubDVertex **)
                                             (bQuadVertexIsSmoothOrCrease +
                                             (ulong)((int)e._4_4_ + 1U & 3) * 8)), bVar2)) &&
                       ((bVar2 = ON_SubDVertex::IsCrease
                                           (*(ON_SubDVertex **)
                                             (bQuadVertexIsSmoothOrCrease +
                                             (ulong)((int)e._4_4_ + 3U & 3) * 8)), bVar2 &&
                        (bVar2 = IsOrdinarySmoothQuadCornerVertex
                                           (*(ON_SubDVertex **)
                                             (bQuadVertexIsSmoothOrCrease +
                                             (ulong)((int)e._4_4_ + 2U & 3) * 8)), bVar2)))))))) {
                    pOVar1 = this->m_edge_grid[(int)e._4_4_ + 1U & 3][0];
                    this_00 = this->m_edge_grid[(int)e._4_4_ + 2U & 3][1];
                    if ((pOVar1 != (ON_SubDEdge *)0x0) &&
                       (((this_00 != (ON_SubDEdge *)0x0 &&
                         (bVar2 = ON_SubDEdge::IsCrease(pOVar1), bVar2)) &&
                        ((bVar2 = ON_SubDEdge::IsCrease(this_00), bVar2 && (local_dc != 0)))))) {
                      bVar2 = ON_SubDVertex::IsCrease
                                        (*(ON_SubDVertex **)
                                          (bQuadVertexIsSmoothOrCrease + (ulong)(uint)e._4_4_ * 8));
                      if (bVar2) {
                        bExtraordinaryCornerVertex[0] = e._4_1_;
                        bExtraordinaryCornerVertex[1] = e._5_1_;
                        bExtraordinaryCornerVertex[2] = e._6_1_;
                        bExtraordinaryCornerVertex[3] = e._7_1_;
                        *(undefined1 *)((long)quad_vertex + (ulong)(uint)e._4_4_ + 0x18) = 0;
                      }
                      else {
                        bVar2 = ON_SubDVertex::IsCorner
                                          (*(ON_SubDVertex **)
                                            (bQuadVertexIsSmoothOrCrease + (ulong)(uint)e._4_4_ * 8)
                                          );
                        if (bVar2) {
                          quad_vertex[3]._4_1_ = e._4_1_;
                          quad_vertex[3]._5_1_ = e._5_1_;
                          quad_vertex[3]._6_1_ = e._6_1_;
                          quad_vertex[3]._7_1_ = e._7_1_;
                        }
                      }
                    }
                  }
                }
                else {
                  bVar2 = ON_SubDVertex::IsCrease
                                    (*(ON_SubDVertex **)
                                      (bQuadVertexIsSmoothOrCrease + (ulong)(uint)e._4_4_ * 8));
                  if ((((bVar2) &&
                       (pOVar1 = this->m_edge_grid[(uint)e._4_4_][0], pOVar1 != (ON_SubDEdge *)0x0))
                      && (bVar2 = ON_SubDEdge::IsCrease(pOVar1), bVar2)) &&
                     ((pOVar5 = SideFace(this,(uint)e._4_4_), pOVar5 != (ON_SubDFace *)0x0 &&
                      (pOVar5->m_edge_count == 4)))) {
                    *(undefined1 *)((long)quad_vertex + (ulong)(uint)e._4_4_ + 0x18) = 0;
                  }
                }
              }
              else {
                bVar2 = ON_SubDVertex::IsCrease
                                  (*(ON_SubDVertex **)
                                    (bQuadVertexIsSmoothOrCrease + (ulong)(uint)e._4_4_ * 8));
                if (((bVar2) &&
                    (pOVar1 = this->m_edge_grid[(int)e._4_4_ + 3U & 3][1],
                    pOVar1 != (ON_SubDEdge *)0x0)) &&
                   ((bVar2 = ON_SubDEdge::IsCrease(pOVar1), bVar2 &&
                    ((pOVar5 = SideFace(this,(int)e._4_4_ + 3U & 3), pOVar5 != (ON_SubDFace *)0x0 &&
                     (pOVar5->m_edge_count == 4)))))) {
                  *(undefined1 *)((long)quad_vertex + (ulong)(uint)e._4_4_ + 0x18) = 0;
                }
              }
            }
            else {
              bVar2 = IsOrdinarySmoothQuadCornerVertex
                                (*(ON_SubDVertex **)
                                  (bQuadVertexIsSmoothOrCrease + (ulong)(uint)e._4_4_ * 8));
              if (bVar2) {
                *(undefined1 *)((long)quad_vertex + (ulong)(uint)e._4_4_ + 0x18) = 0;
              }
            }
          }
        }
      }
      this->m_extraordinary_corner_vertex_count = '\0';
      for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
        this->m_bExtraordinaryCornerVertex[local_bc] =
             (bool)(*(byte *)((long)quad_vertex + (ulong)local_bc + 0x18) & 1);
        if ((*(byte *)((long)quad_vertex + (ulong)local_bc + 0x18) & 1) != 0) {
          this->m_extraordinary_corner_vertex_count =
               this->m_extraordinary_corner_vertex_count + '\x01';
        }
      }
      this->m_exact_quadrant_patch_count = '\0';
      for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
        this->m_bExactQuadrantPatch[local_c0] = false;
        if (((this->m_boundary_crease_count < 3) &&
            ((((this->m_boundary_crease_count != '\x02' || ((uint)bExtraordinaryCornerVertex < 4))
              || (((uint)quad_vertex[3]._4_4_ < 4 &&
                  (((int)quad_vertex[3]._4_4_ + 2U & 3) == local_c0)))) &&
             ((((*(byte *)((long)&boundary_crease_corner_index + (ulong)local_c0) & 1) == 0 &&
               ((*(byte *)((long)quad_vertex + (ulong)local_c0 + 0x18) & 1) == 0)) &&
              ((*(byte *)((long)quad_vertex + (ulong)(local_c0 + 1 & 3) + 0x18) & 1) == 0)))))) &&
           ((*(byte *)((long)quad_vertex + (ulong)(local_c0 + 3 & 3) + 0x18) & 1) == 0)) {
          this->m_bExactQuadrantPatch[local_c0] = true;
          this->m_exact_quadrant_patch_count = this->m_exact_quadrant_patch_count + '\x01';
        }
      }
      min_face_grid_dex_00.j = max_face_grid_dex.j;
      min_face_grid_dex_00.i = max_face_grid_dex.i;
      max_face_grid_dex_00.j = fvi1;
      max_face_grid_dex_00.i = fvi2;
      bVar2 = VertexGridIsExactCubicPatch
                        (this,min_face_grid_dex_00,max_face_grid_dex_00,
                         (uint)bExtraordinaryCornerVertex);
      this->m_bIsCubicPatch = bVar2;
      return;
    }
    if (((this->m_center_edges[i_1] == (ON_SubDEdge *)0x0) ||
        (this->m_center_edges[i_1]->m_edge_tag == SmoothX)) ||
       ((local_38[i_1] & 1) == (local_38[(ulong)i_1 - 4] & 1))) {
      bSharpQuadrant[3] = true;
      goto LAB_008fc9df;
    }
    i_1 = i_1 + 1;
  } while( true );
}

Assistant:

void ON_SubDQuadNeighborhood::SetPatchStatus(
  const unsigned int fvi0
  )
{
  m_bIsCubicPatch = false;

  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned int delta_subdivision_level 
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? ((unsigned int)(m_current_subdivision_level - m_initial_subdivision_level))
    : 0U;

  ON_2dex min_face_grid_dex = { 0, 0 };
  ON_2dex max_face_grid_dex = { 3, 3 };

  m_boundary_crease_count = 0;
  if (m_bBoundaryCrease[0])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.j++;
  }
  if (m_bBoundaryCrease[1])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.i--;
  }
  if (m_bBoundaryCrease[2])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.j--;
  }
  if (m_bBoundaryCrease[3])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.i++;
  }


  const unsigned int fvi1 = (fvi0+1)%4;
  const unsigned int fvi2 = (fvi0+2)%4;
  const unsigned int fvi3 = (fvi0+3)%4;

  bool bCenterEdgeIsSmooth[4] = {};
  bCenterEdgeIsSmooth[fvi0] = m_center_edges[fvi0]->IsSmoothNotX();
  bCenterEdgeIsSmooth[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi3] = m_center_edges[fvi3]->IsSmoothNotX();

  bool bCenterEdgeIsCrease[4] = {};
  bCenterEdgeIsCrease[fvi0] = bCenterEdgeIsSmooth[fvi0] ? false : m_center_edges[fvi0]->IsCrease();
  bCenterEdgeIsCrease[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi3] = bCenterEdgeIsSmooth[fvi3] ? false : m_center_edges[fvi3]->IsCrease();

  bool bEdgeTagX = false;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (
      nullptr != m_center_edges[i]
      && ON_SubDEdgeTag::SmoothX != m_center_edges[i]->m_edge_tag
      && (bCenterEdgeIsSmooth[i] != bCenterEdgeIsCrease[i])
      )
    {
      continue;
    }
    bEdgeTagX = true;
    break;
  }

  m_sharp_edge_count = 0;
  bool bSharpQuadrant[4] = {};
  for(unsigned int i = 0; i < 4; ++i)
  {
    if (nullptr != m_center_edges[i] && m_center_edges[i]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[0] = true;
      bSharpQuadrant[1] = true;
      bSharpQuadrant[2] = true;
      bSharpQuadrant[3] = true;
    }
    if (nullptr != this->m_edge_grid[i][0] && this->m_edge_grid[i][0]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
    if (nullptr != this->m_edge_grid[i][1] && this->m_edge_grid[i][1]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i % 4U] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
  }

  ////////////////////////////////////////////////////////////////////////////
  //
  // Set 
  //  m_bExtraordinaryCornerVertex[], m_extraordinary_corner_vertex_count
  //  m_bExactQuadrantPatch[], and m_exact_quadrant_patch_count
  // 
  unsigned int boundary_crease_corner_index = 86U;
  unsigned int boundary_corner_corner_index = 86U;

  bool bExtraordinaryCornerVertex[4] = {};
  bExtraordinaryCornerVertex[fvi0] = true;
  bExtraordinaryCornerVertex[fvi1] = (0 == delta_subdivision_level || bEdgeTagX);
  bExtraordinaryCornerVertex[fvi2] = bExtraordinaryCornerVertex[fvi1];
  bExtraordinaryCornerVertex[fvi3] = bExtraordinaryCornerVertex[fvi1];


  const ON_SubDVertex* quad_vertex[4] = {
    m_vertex_grid[1][1],
    m_vertex_grid[2][1],
    m_vertex_grid[2][2],
    m_vertex_grid[1][2]
  };

  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    // Dale Lear 2024 Feb 28 Fix RH-80676
    // Even when bSharpQuadrant[corner_index] is true from tests above,
    // we have to call quad_vertex[corner_index]->VertexSharpness() to
    // insure all sharp edges are taken into account.
    if (quad_vertex[corner_index]->VertexSharpness() > 0.0)
    {
      bSharpQuadrant[corner_index] = true;
      bSharpQuadrant[(corner_index + 1U) % 4U] = true;
      bSharpQuadrant[(corner_index + 3U) % 4U] = true;
    }
  }

  if (false == bEdgeTagX)
  {
    const bool bQuadVertexIsSmoothOrCrease[4] =
    {
      quad_vertex[0]->IsSmoothOrCrease(),
      quad_vertex[1]->IsSmoothOrCrease(),
      quad_vertex[2]->IsSmoothOrCrease(),
      quad_vertex[3]->IsSmoothOrCrease()
    };

    for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
    {
      if (false == bExtraordinaryCornerVertex[corner_index])
        continue;

      if (quad_vertex[corner_index]->IsDart())
        continue;

      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+1)%4])
        continue;
      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+3)%4])
        continue;

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (IsOrdinarySmoothQuadCornerVertex(quad_vertex[corner_index]))
          bExtraordinaryCornerVertex[corner_index] = false;
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[(corner_index + 3) % 4][1];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace((corner_index + 3) % 4);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[corner_index][0];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace(corner_index);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (
          (quad_vertex[corner_index]->IsCrease() || quad_vertex[corner_index]->IsCorner())
          && quad_vertex[(corner_index + 1) % 4]->IsCrease()
          && quad_vertex[(corner_index + 3) % 4]->IsCrease()
          && IsOrdinarySmoothQuadCornerVertex(quad_vertex[(corner_index + 2) % 4])
          )
        {
          const ON_SubDEdge* e1 = m_edge_grid[(corner_index + 1) % 4][0];
          const ON_SubDEdge* e2 = m_edge_grid[(corner_index + 2) % 4][1];
          if (nullptr != e1 && nullptr != e2 && e1->IsCrease() && e2->IsCrease())
          {
            if (delta_subdivision_level > 0)
            {
              if (quad_vertex[corner_index]->IsCrease())
              {
                boundary_crease_corner_index = corner_index;
                bExtraordinaryCornerVertex[corner_index] = false;
              }
              else if ( quad_vertex[corner_index]->IsCorner() )
              {
                boundary_corner_corner_index = corner_index;
              }
            }
          }
        }
        continue;
      }

    }
  }

  m_extraordinary_corner_vertex_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExtraordinaryCornerVertex[corner_index] = bExtraordinaryCornerVertex[corner_index];
    if (bExtraordinaryCornerVertex[corner_index])
      m_extraordinary_corner_vertex_count++;
  }

  m_exact_quadrant_patch_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExactQuadrantPatch[corner_index] = false;
    if (m_boundary_crease_count > 2)
      continue;
    if (2 == m_boundary_crease_count)
    {
      if (boundary_crease_corner_index >= 4)
      {
        if ( boundary_corner_corner_index >= 4 || ((boundary_corner_corner_index+2)%4) != corner_index)
          continue;
      }
    }
    if (bSharpQuadrant[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 1) % 4])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 3) % 4])
      continue;
    m_bExactQuadrantPatch[corner_index] = true;
    m_exact_quadrant_patch_count++;
  }

  // Set m_bIsCubicPatch
  m_bIsCubicPatch = VertexGridIsExactCubicPatch(
    min_face_grid_dex,
    max_face_grid_dex,
    boundary_crease_corner_index
    );
}